

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_specific_extensions.cpp
# Opt level: O2

void __thiscall
tlm_utils::instance_specific_extension_container::~instance_specific_extension_container
          (instance_specific_extension_container *this)

{
  pointer ppiVar1;
  instance_specific_extensions_per_accessor *this_00;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppiVar1 = (this->m_ispex_per_accessor).
              super__Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_ispex_per_accessor).
                      super__Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppiVar1 >> 3) <=
        (ulong)uVar2) break;
    this_00 = ppiVar1[uVar2];
    if (this_00 != (instance_specific_extensions_per_accessor *)0x0) {
      tlm::tlm_array<tlm_utils::ispex_base_*>::~tlm_array(&this_00->m_extensions);
    }
    operator_delete(this_00);
    uVar2 = uVar2 + 1;
  }
  std::
  _Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
  ::~_Vector_base((_Vector_base<tlm_utils::instance_specific_extensions_per_accessor_*,_std::allocator<tlm_utils::instance_specific_extensions_per_accessor_*>_>
                   *)this);
  return;
}

Assistant:

instance_specific_extension_container::
  ~instance_specific_extension_container()
{
  for (unsigned int i=0; i<m_ispex_per_accessor.size(); ++i)
    delete m_ispex_per_accessor[i];
}